

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

void __thiscall
qclab::dense::SquareMatrix<float>::SquareMatrix(SquareMatrix<float> *this,int64_t size,float value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  
  this->size_ = size;
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                  ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = float]");
  }
  uVar6 = size * size;
  lVar7 = 0;
  pfVar4 = (float *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
  auVar3 = _DAT_00167030;
  auVar2 = _DAT_00167020;
  auVar1 = _DAT_00167010;
  uVar5 = uVar6 + 0x3fffffffffffffff & 0x3fffffffffffffff;
  auVar8._8_4_ = (int)uVar5;
  auVar8._0_8_ = uVar5;
  auVar8._12_4_ = (int)(uVar5 >> 0x20);
  auVar8 = auVar8 ^ _DAT_00167030;
  do {
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar11 = (auVar10 | auVar2) ^ auVar3;
    iVar9 = auVar8._4_4_;
    if ((bool)(~(auVar11._4_4_ == iVar9 && auVar8._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_) &
              1)) {
      pfVar4[lVar7] = value;
    }
    if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
        auVar11._12_4_ <= auVar8._12_4_) {
      pfVar4[lVar7 + 1] = value;
    }
    auVar10 = (auVar10 | auVar1) ^ auVar3;
    iVar12 = auVar10._4_4_;
    if (iVar12 <= iVar9 && (iVar12 != iVar9 || auVar10._0_4_ <= auVar8._0_4_)) {
      pfVar4[lVar7 + 2] = value;
      pfVar4[lVar7 + 3] = value;
    }
    lVar7 = lVar7 + 4;
  } while ((uVar5 - ((uint)(uVar6 + 0x3fffffffffffffff) & 3)) + 4 != lVar7);
  (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
  if (size < 1) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                  ,0x35,
                  "qclab::dense::SquareMatrix<float>::SquareMatrix(const int64_t, const T) [T = float]"
                 );
  }
  return;
}

Assistant:

SquareMatrix( const int64_t size , const T value )
        : size_( size )
        , data_( init_unique_array< T >( size * size , value ) )
        {
          assert( size > 0 ) ;
        }